

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O3

void __thiscall
wasm::Visitor<wasm::BinaryInstWriter,_void>::visit
          (Visitor<wasm::BinaryInstWriter,_void> *this,Expression *curr)

{
  if (curr != (Expression *)0x0) {
    switch(curr->_id) {
    case BlockId:
      BinaryInstWriter::visitBlock((BinaryInstWriter *)this,(Block *)curr);
      return;
    case IfId:
      BinaryInstWriter::visitIf((BinaryInstWriter *)this,(If *)curr);
      return;
    case LoopId:
      BinaryInstWriter::visitLoop((BinaryInstWriter *)this,(Loop *)curr);
      return;
    case BreakId:
      BinaryInstWriter::visitBreak((BinaryInstWriter *)this,(Break *)curr);
      return;
    case SwitchId:
      BinaryInstWriter::visitSwitch((BinaryInstWriter *)this,(Switch *)curr);
      return;
    case CallId:
      BinaryInstWriter::visitCall((BinaryInstWriter *)this,(Call *)curr);
      return;
    case CallIndirectId:
      BinaryInstWriter::visitCallIndirect((BinaryInstWriter *)this,(CallIndirect *)curr);
      return;
    case LocalGetId:
      BinaryInstWriter::visitLocalGet((BinaryInstWriter *)this,(LocalGet *)curr);
      return;
    case LocalSetId:
      BinaryInstWriter::visitLocalSet((BinaryInstWriter *)this,(LocalSet *)curr);
      return;
    case GlobalGetId:
      BinaryInstWriter::visitGlobalGet((BinaryInstWriter *)this,(GlobalGet *)curr);
      return;
    case GlobalSetId:
      BinaryInstWriter::visitGlobalSet((BinaryInstWriter *)this,(GlobalSet *)curr);
      return;
    case LoadId:
      BinaryInstWriter::visitLoad((BinaryInstWriter *)this,(Load *)curr);
      return;
    case StoreId:
      BinaryInstWriter::visitStore((BinaryInstWriter *)this,(Store *)curr);
      return;
    case ConstId:
      BinaryInstWriter::visitConst((BinaryInstWriter *)this,(Const *)curr);
      return;
    case UnaryId:
      BinaryInstWriter::visitUnary((BinaryInstWriter *)this,(Unary *)curr);
      return;
    case BinaryId:
      BinaryInstWriter::visitBinary((BinaryInstWriter *)this,(Binary *)curr);
      return;
    case SelectId:
      BinaryInstWriter::visitSelect((BinaryInstWriter *)this,(Select *)curr);
      return;
    case DropId:
      BinaryInstWriter::visitDrop((BinaryInstWriter *)this,(Drop *)curr);
      return;
    case ReturnId:
      BinaryInstWriter::visitReturn((BinaryInstWriter *)this,(Return *)curr);
      return;
    case MemorySizeId:
      BinaryInstWriter::visitMemorySize((BinaryInstWriter *)this,(MemorySize *)curr);
      return;
    case MemoryGrowId:
      BinaryInstWriter::visitMemoryGrow((BinaryInstWriter *)this,(MemoryGrow *)curr);
      return;
    case NopId:
      BinaryInstWriter::visitNop((BinaryInstWriter *)this,(Nop *)curr);
      return;
    case UnreachableId:
      BinaryInstWriter::visitUnreachable((BinaryInstWriter *)this,(Unreachable *)curr);
      return;
    case AtomicRMWId:
      BinaryInstWriter::visitAtomicRMW((BinaryInstWriter *)this,(AtomicRMW *)curr);
      return;
    case AtomicCmpxchgId:
      BinaryInstWriter::visitAtomicCmpxchg((BinaryInstWriter *)this,(AtomicCmpxchg *)curr);
      return;
    case AtomicWaitId:
      BinaryInstWriter::visitAtomicWait((BinaryInstWriter *)this,(AtomicWait *)curr);
      return;
    case AtomicNotifyId:
      BinaryInstWriter::visitAtomicNotify((BinaryInstWriter *)this,(AtomicNotify *)curr);
      return;
    case AtomicFenceId:
      BinaryInstWriter::visitAtomicFence((BinaryInstWriter *)this,(AtomicFence *)curr);
      return;
    case SIMDExtractId:
      BinaryInstWriter::visitSIMDExtract((BinaryInstWriter *)this,(SIMDExtract *)curr);
      return;
    case SIMDReplaceId:
      BinaryInstWriter::visitSIMDReplace((BinaryInstWriter *)this,(SIMDReplace *)curr);
      return;
    case SIMDShuffleId:
      BinaryInstWriter::visitSIMDShuffle((BinaryInstWriter *)this,(SIMDShuffle *)curr);
      return;
    case SIMDTernaryId:
      BinaryInstWriter::visitSIMDTernary((BinaryInstWriter *)this,(SIMDTernary *)curr);
      return;
    case SIMDShiftId:
      BinaryInstWriter::visitSIMDShift((BinaryInstWriter *)this,(SIMDShift *)curr);
      return;
    case SIMDLoadId:
      BinaryInstWriter::visitSIMDLoad((BinaryInstWriter *)this,(SIMDLoad *)curr);
      return;
    case SIMDLoadStoreLaneId:
      BinaryInstWriter::visitSIMDLoadStoreLane((BinaryInstWriter *)this,(SIMDLoadStoreLane *)curr);
      return;
    case MemoryInitId:
      BinaryInstWriter::visitMemoryInit((BinaryInstWriter *)this,(MemoryInit *)curr);
      return;
    case DataDropId:
      BinaryInstWriter::visitDataDrop((BinaryInstWriter *)this,(DataDrop *)curr);
      return;
    case MemoryCopyId:
      BinaryInstWriter::visitMemoryCopy((BinaryInstWriter *)this,(MemoryCopy *)curr);
      return;
    case MemoryFillId:
      BinaryInstWriter::visitMemoryFill((BinaryInstWriter *)this,(MemoryFill *)curr);
      return;
    case PopId:
      BinaryInstWriter::visitPop((BinaryInstWriter *)this,(Pop *)curr);
      return;
    case RefNullId:
      BinaryInstWriter::visitRefNull((BinaryInstWriter *)this,(RefNull *)curr);
      return;
    case RefIsNullId:
      BinaryInstWriter::visitRefIsNull((BinaryInstWriter *)this,(RefIsNull *)curr);
      return;
    case RefFuncId:
      BinaryInstWriter::visitRefFunc((BinaryInstWriter *)this,(RefFunc *)curr);
      return;
    case RefEqId:
      BinaryInstWriter::visitRefEq((BinaryInstWriter *)this,(RefEq *)curr);
      return;
    case TableGetId:
      BinaryInstWriter::visitTableGet((BinaryInstWriter *)this,(TableGet *)curr);
      return;
    case TableSetId:
      BinaryInstWriter::visitTableSet((BinaryInstWriter *)this,(TableSet *)curr);
      return;
    case TableSizeId:
      BinaryInstWriter::visitTableSize((BinaryInstWriter *)this,(TableSize *)curr);
      return;
    case TableGrowId:
      BinaryInstWriter::visitTableGrow((BinaryInstWriter *)this,(TableGrow *)curr);
      return;
    case TableFillId:
      BinaryInstWriter::visitTableFill((BinaryInstWriter *)this,(TableFill *)curr);
      return;
    case TableCopyId:
      BinaryInstWriter::visitTableCopy((BinaryInstWriter *)this,(TableCopy *)curr);
      return;
    case TableInitId:
      BinaryInstWriter::visitTableInit((BinaryInstWriter *)this,(TableInit *)curr);
      return;
    case TryId:
      BinaryInstWriter::visitTry((BinaryInstWriter *)this,(Try *)curr);
      return;
    case TryTableId:
      BinaryInstWriter::visitTryTable((BinaryInstWriter *)this,(TryTable *)curr);
      return;
    case ThrowId:
      BinaryInstWriter::visitThrow((BinaryInstWriter *)this,(Throw *)curr);
      return;
    case RethrowId:
      BinaryInstWriter::visitRethrow((BinaryInstWriter *)this,(Rethrow *)curr);
      return;
    case ThrowRefId:
      BinaryInstWriter::visitThrowRef((BinaryInstWriter *)this,(ThrowRef *)curr);
      return;
    case TupleMakeId:
      BinaryInstWriter::visitTupleMake((BinaryInstWriter *)this,(TupleMake *)curr);
      return;
    case TupleExtractId:
      BinaryInstWriter::visitTupleExtract((BinaryInstWriter *)this,(TupleExtract *)curr);
      return;
    case RefI31Id:
      BinaryInstWriter::visitRefI31((BinaryInstWriter *)this,(RefI31 *)curr);
      return;
    case I31GetId:
      BinaryInstWriter::visitI31Get((BinaryInstWriter *)this,(I31Get *)curr);
      return;
    case CallRefId:
      BinaryInstWriter::visitCallRef((BinaryInstWriter *)this,(CallRef *)curr);
      return;
    case RefTestId:
      BinaryInstWriter::visitRefTest((BinaryInstWriter *)this,(RefTest *)curr);
      return;
    case RefCastId:
      BinaryInstWriter::visitRefCast((BinaryInstWriter *)this,(RefCast *)curr);
      return;
    case BrOnId:
      BinaryInstWriter::visitBrOn((BinaryInstWriter *)this,(BrOn *)curr);
      return;
    case StructNewId:
      BinaryInstWriter::visitStructNew((BinaryInstWriter *)this,(StructNew *)curr);
      return;
    case StructGetId:
      BinaryInstWriter::visitStructGet((BinaryInstWriter *)this,(StructGet *)curr);
      return;
    case StructSetId:
      BinaryInstWriter::visitStructSet((BinaryInstWriter *)this,(StructSet *)curr);
      return;
    case StructRMWId:
      BinaryInstWriter::visitStructRMW((BinaryInstWriter *)this,(StructRMW *)curr);
      return;
    case StructCmpxchgId:
      BinaryInstWriter::visitStructCmpxchg((BinaryInstWriter *)this,(StructCmpxchg *)curr);
      return;
    case ArrayNewId:
      BinaryInstWriter::visitArrayNew((BinaryInstWriter *)this,(ArrayNew *)curr);
      return;
    case ArrayNewDataId:
      BinaryInstWriter::visitArrayNewData((BinaryInstWriter *)this,(ArrayNewData *)curr);
      return;
    case ArrayNewElemId:
      BinaryInstWriter::visitArrayNewElem((BinaryInstWriter *)this,(ArrayNewElem *)curr);
      return;
    case ArrayNewFixedId:
      BinaryInstWriter::visitArrayNewFixed((BinaryInstWriter *)this,(ArrayNewFixed *)curr);
      return;
    case ArrayGetId:
      BinaryInstWriter::visitArrayGet((BinaryInstWriter *)this,(ArrayGet *)curr);
      return;
    case ArraySetId:
      BinaryInstWriter::visitArraySet((BinaryInstWriter *)this,(ArraySet *)curr);
      return;
    case ArrayLenId:
      BinaryInstWriter::visitArrayLen((BinaryInstWriter *)this,(ArrayLen *)curr);
      return;
    case ArrayCopyId:
      BinaryInstWriter::visitArrayCopy((BinaryInstWriter *)this,(ArrayCopy *)curr);
      return;
    case ArrayFillId:
      BinaryInstWriter::visitArrayFill((BinaryInstWriter *)this,(ArrayFill *)curr);
      return;
    case ArrayInitDataId:
      BinaryInstWriter::visitArrayInitData((BinaryInstWriter *)this,(ArrayInitData *)curr);
      return;
    case ArrayInitElemId:
      BinaryInstWriter::visitArrayInitElem((BinaryInstWriter *)this,(ArrayInitElem *)curr);
      return;
    case RefAsId:
      BinaryInstWriter::visitRefAs((BinaryInstWriter *)this,(RefAs *)curr);
      return;
    case StringNewId:
      BinaryInstWriter::visitStringNew((BinaryInstWriter *)this,(StringNew *)curr);
      return;
    case StringConstId:
      BinaryInstWriter::visitStringConst((BinaryInstWriter *)this,(StringConst *)curr);
      return;
    case StringMeasureId:
      BinaryInstWriter::visitStringMeasure((BinaryInstWriter *)this,(StringMeasure *)curr);
      return;
    case StringEncodeId:
      BinaryInstWriter::visitStringEncode((BinaryInstWriter *)this,(StringEncode *)curr);
      return;
    case StringConcatId:
      BinaryInstWriter::visitStringConcat((BinaryInstWriter *)this,(StringConcat *)curr);
      return;
    case StringEqId:
      BinaryInstWriter::visitStringEq((BinaryInstWriter *)this,(StringEq *)curr);
      return;
    case StringWTF16GetId:
      BinaryInstWriter::visitStringWTF16Get((BinaryInstWriter *)this,(StringWTF16Get *)curr);
      return;
    case StringSliceWTFId:
      BinaryInstWriter::visitStringSliceWTF((BinaryInstWriter *)this,(StringSliceWTF *)curr);
      return;
    case ContNewId:
      BinaryInstWriter::visitContNew((BinaryInstWriter *)this,(ContNew *)curr);
      return;
    case ContBindId:
      BinaryInstWriter::visitContBind((BinaryInstWriter *)this,(ContBind *)curr);
      return;
    case SuspendId:
      BinaryInstWriter::visitSuspend((BinaryInstWriter *)this,(Suspend *)curr);
      return;
    case ResumeId:
      BinaryInstWriter::visitResume((BinaryInstWriter *)this,(Resume *)curr);
      return;
    case ResumeThrowId:
      BinaryInstWriter::visitResumeThrow((BinaryInstWriter *)this,(ResumeThrow *)curr);
      return;
    case StackSwitchId:
      BinaryInstWriter::visitStackSwitch((BinaryInstWriter *)this,(StackSwitch *)curr);
      return;
    default:
      handle_unreachable("unexpected expression type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                         ,0x46);
    }
  }
  __assert_fail("curr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                ,0x3b,
                "ReturnType wasm::Visitor<wasm::BinaryInstWriter>::visit(Expression *) [SubType = wasm::BinaryInstWriter, ReturnType = void]"
               );
}

Assistant:

ReturnType visit(Expression* curr) {
    assert(curr);

    switch (curr->_id) {
#define DELEGATE(CLASS_TO_VISIT)                                               \
  case Expression::Id::CLASS_TO_VISIT##Id:                                     \
    return static_cast<SubType*>(this)->visit##CLASS_TO_VISIT(                 \
      static_cast<CLASS_TO_VISIT*>(curr))

#include "wasm-delegations.def"

      default:
        WASM_UNREACHABLE("unexpected expression type");
    }
  }